

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkTiming.c
# Opt level: O2

int Nwk_ManVerifyTiming(Nwk_Man_t *pNtk)

{
  float fVar1;
  Nwk_Obj_t *pObj;
  int i;
  float fVar2;
  float fVar3;
  
  for (i = 0; i < pNtk->vObjs->nSize; i = i + 1) {
    pObj = (Nwk_Obj_t *)Vec_PtrEntry(pNtk->vObjs,i);
    if ((pObj != (Nwk_Obj_t *)0x0) &&
       (((*(uint *)&pObj->field_0x20 & 7) != 1 || (pObj->nFanouts != 0)))) {
      fVar2 = Nwk_NodeComputeArrival(pObj,1);
      fVar3 = Nwk_NodeComputeRequired(pObj,1);
      fVar1 = pObj->tArrival;
      if ((fVar2 + 0.01 <= fVar1) || (fVar1 + 0.01 <= fVar2)) {
        printf("Nwk_ManVerifyTiming(): Object %d has different arrival time (%.2f) from computed (%.2f).\n"
               ,(double)fVar1,(double)fVar2,(ulong)(uint)pObj->Id);
      }
      fVar1 = pObj->tRequired;
      if ((fVar3 + 0.01 <= fVar1) || (fVar1 + 0.01 <= fVar3)) {
        printf("Nwk_ManVerifyTiming(): Object %d has different required time (%.2f) from computed (%.2f).\n"
               ,(double)fVar1,(double)fVar3,(ulong)(uint)pObj->Id);
      }
    }
  }
  return 1;
}

Assistant:

int Nwk_ManVerifyTiming(  Nwk_Man_t * pNtk )
{
    Nwk_Obj_t * pObj;
    float tArrival, tRequired;
    int i;
    Nwk_ManForEachObj( pNtk, pObj, i )
    {
        if ( Nwk_ObjIsCi(pObj) && Nwk_ObjFanoutNum(pObj) == 0 )
            continue;
        tArrival = Nwk_NodeComputeArrival( pObj, 1 );
        tRequired = Nwk_NodeComputeRequired( pObj, 1 );
        if ( !Nwk_ManTimeEqual( tArrival, Nwk_ObjArrival(pObj), (float)0.01 ) )
            printf( "Nwk_ManVerifyTiming(): Object %d has different arrival time (%.2f) from computed (%.2f).\n", 
                pObj->Id, Nwk_ObjArrival(pObj), tArrival );
        if ( !Nwk_ManTimeEqual( tRequired, Nwk_ObjRequired(pObj), (float)0.01 ) )
            printf( "Nwk_ManVerifyTiming(): Object %d has different required time (%.2f) from computed (%.2f).\n", 
                pObj->Id, Nwk_ObjRequired(pObj), tRequired );
    }
    return 1;
}